

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O2

strong_type<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>,_ezy::features::inherit_std_optional>
* __thiscall
ezy::features::result_interface<ezy::features::optional_adapter>::
impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>>
::_impl::
map<ezy::strong_type<std::optional<std::__cxx11::string>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>,ezy::features::optional_adapter<std::optional<std::__cxx11::string>>,ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>,ezy::to_string_fn_const&>
          (strong_type<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>,_ezy::features::inherit_std_optional>
           *__return_storage_ptr__,_impl *this,
          strong_type<std::optional<int>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>,_ezy::features::inherit_std_optional>
          *t,to_string_fn *fn)

{
  int *piVar1;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  string local_38;
  
  if (this[4] == (_impl)0x1) {
    piVar1 = optional_adapter<std::optional<int>>::get_success<std::optional<int>>
                       ((optional<int> *)this);
    std::__cxx11::to_string(&local_38,*piVar1);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_60,&local_38);
    std::
    _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      *)__return_storage_ptr__,
                     (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      *)&local_60);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_60);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    local_60._M_engaged = false;
    std::
    _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      *)__return_storage_ptr__,
                     (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      *)&local_60);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

static constexpr Result map(ST&& t, Fn&& fn)
        {
          using SourceTrait = Adapter<typename ezy::remove_cvref_t<ST>::type>;
          return detail::map<Result, SourceTrait, ResultTrait>(std::forward<ST>(t), std::forward<Fn>(fn));
        }